

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  
  addVariable("PI",3.141592653589793);
  addVariable("E",2.718281828459045);
  addVariable("G",9.80665);
  addVariable("GR",1.618033988749895);
  assertEqual("9","9");
  assertEqual("5","(3+2)");
  assertEqual("4","(3+2)-1");
  assertEqual("7","5--2");
  assertEqual("5","a=1;4+a");
  assertEqual("21","a=20;a+1");
  assertEqual("10.8377655357568","5+(cos(2)-2)^2");
  assertEqual("8.14159265358979","5+PI");
  assertEqual("7.61803398874989","6+GR");
  assertEqual("25","a=12;b=a;a+b+1");
  assertEqual("0.282777605186477","sin(1)+cos(2)+tan(3)");
  assertEqual("51","abs(-53 + 2)");
  assertEqual("5","floor(4.8)+ceil(0.3)");
  assertEqual("0.693147180559945","log(2)");
  assertEqual("1.4142135623731","sqrt(1+0.5+0.5)");
  assertEqual("nan","sqrt(-2)");
  result_precision = 2;
  assertEqual("0.12","0.123456");
  degree = true;
  assertEqual("1","sin(90)");
  freeVariables();
  bVar1 = failed == 0;
  if (bVar1) {
    puts("\nAll tests have succeeded.");
  }
  else {
    printf("\nFailed tests: %zu.\n");
  }
  return (uint)!bVar1;
}

Assistant:

int main(int argc, char* argv[])
{
    setUp();
    assertEqual("9", "9");
    assertEqual("5", "(3+2)");
    assertEqual("4", "(3+2)-1");
    assertEqual("7", "5--2");
    assertEqual("5", "a=1;4+a");
    assertEqual("21", "a=20;a+1");
    assertEqual("10.8377655357568", "5+(cos(2)-2)^2");
    assertEqual("8.14159265358979", "5+PI");
    assertEqual("7.61803398874989", "6+GR");
    assertEqual("25", "a=12;b=a;a+b+1");
    assertEqual("0.282777605186477", "sin(1)+cos(2)+tan(3)");
    assertEqual("51", "abs(-53 + 2)");
    assertEqual("5", "floor(4.8)+ceil(0.3)");
    assertEqual("0.693147180559945", "log(2)");
    assertEqual("1.4142135623731", "sqrt(1+0.5+0.5)");
    assertEqual("nan", "sqrt(-2)");
    result_precision = 2;
    assertEqual("0.12", "0.123456");
    degree = 1;
    assertEqual("1", "sin(90)");
    tearDown();

    if (failed >= 1) {
        printf("\nFailed tests: %zu.\n", failed);
        return 1;
    }

    printf("\nAll tests have succeeded.\n");
    return 0;
}